

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O3

void __thiscall duckdb::PlanEnumerator::InitLeafPlans(PlanEnumerator *this)

{
  idx_t *piVar1;
  long lVar2;
  _Head_base<0UL,_duckdb::DPJoinNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::DPJoinNode_*,_false> _Var4;
  pointer pRVar5;
  undefined8 uVar6;
  optional_ptr<duckdb::JoinRelationSet,_true> set;
  DPJoinNode *this_00;
  pointer pDVar7;
  mapped_type *pmVar8;
  pointer *__ptr;
  long lVar9;
  idx_t index;
  vector<duckdb::RelationStats,_true> relation_stats;
  value_type stats;
  _Head_base<0UL,_duckdb::DPJoinNode_*,_false> local_c8;
  vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_> local_c0;
  _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a8;
  key_type local_a0;
  undefined1 local_98 [72];
  _Alloc_hider local_50;
  char local_40 [16];
  
  RelationManager::GetRelationStats
            ((vector<duckdb::RelationStats,_true> *)&local_c0,
             &this->query_graph_manager->relation_manager);
  CardinalityEstimator::InitEquivalentRelations
            (&this->cost_model->cardinality_estimator,
             &this->query_graph_manager->filters_and_bindings);
  if (local_c0.super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_c0.super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_a8 = (_Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&this->plans;
    lVar9 = 0x30;
    index = 0;
    do {
      pRVar5 = local_c0.
               super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::vector
                ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)local_98,
                 (vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
                 ((long)local_c0.
                        super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x30));
      local_98[0x28] = *(undefined1 *)((long)pRVar5 + lVar9 + -8);
      piVar1 = (idx_t *)((long)pRVar5 + lVar9 + -0x18);
      local_98._24_8_ = *piVar1;
      local_98._32_8_ = piVar1[1];
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_98 + 0x30),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&(pRVar5->column_distinct_count).
                          super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          .
                          super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar9));
      local_50._M_p = local_40;
      lVar2 = *(long *)((long)&pRVar5->cardinality + lVar9);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar2,*(long *)((long)&pRVar5->filter_strength + lVar9) + lVar2
                );
      set.ptr = JoinRelationSetManager::GetJoinRelation
                          (&this->query_graph_manager->set_manager,index);
      this_00 = (DPJoinNode *)operator_new(0x38);
      DPJoinNode::DPJoinNode(this_00,set.ptr);
      local_c8._M_head_impl = this_00;
      pDVar7 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
               operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                           *)&local_c8);
      uVar6 = local_98._24_8_;
      pDVar7->cost = 0.0;
      pDVar7 = unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>::
               operator->((unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>
                           *)&local_c8);
      pDVar7->cardinality = uVar6;
      local_a0._M_data = set.ptr;
      pmVar8 = ::std::__detail::
               _Map_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_a8,&local_a0);
      _Var4._M_head_impl = local_c8._M_head_impl;
      local_c8._M_head_impl = (DPJoinNode *)0x0;
      _Var3._M_head_impl =
           (pmVar8->super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>).
           _M_t.super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
           super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl;
      (pmVar8->super_unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>)._M_t.
      super___uniq_ptr_impl<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DPJoinNode_*,_std::default_delete<duckdb::DPJoinNode>_>.
      super__Head_base<0UL,_duckdb::DPJoinNode_*,_false>._M_head_impl = _Var4._M_head_impl;
      if (_Var3._M_head_impl != (DPJoinNode *)0x0) {
        operator_delete(_Var3._M_head_impl);
      }
      CardinalityEstimator::InitCardinalityEstimatorProps
                (&this->cost_model->cardinality_estimator,set,(RelationStats *)local_98);
      if (local_c8._M_head_impl != (DPJoinNode *)0x0) {
        operator_delete(local_c8._M_head_impl);
      }
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_98 + 0x30));
      if ((pointer)local_98._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_98._0_8_);
      }
      index = index + 1;
      lVar9 = lVar9 + 0x68;
    } while (index < (ulong)(((long)local_c0.
                                    super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_c0.
                                    super__Vector_base<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x4ec4ec4ec4ec4ec5));
  }
  ::std::vector<duckdb::RelationStats,_std::allocator<duckdb::RelationStats>_>::~vector(&local_c0);
  return;
}

Assistant:

void PlanEnumerator::InitLeafPlans() {
	// First we initialize each of the single-node plans with themselves and with their cardinalities these are the leaf
	// nodes of the join tree NOTE: we can just use pointers to JoinRelationSet* here because the GetJoinRelation
	// function ensures that a unique combination of relations will have a unique JoinRelationSet object.
	// first initialize equivalent relations based on the filters
	auto relation_stats = query_graph_manager.relation_manager.GetRelationStats();

	cost_model.cardinality_estimator.InitEquivalentRelations(query_graph_manager.GetFilterBindings());
	cost_model.cardinality_estimator.AddRelationNamesToTdoms(relation_stats);

	// then update the total domains based on the cardinalities of each relation.
	for (idx_t i = 0; i < relation_stats.size(); i++) {
		auto stats = relation_stats.at(i);
		auto &relation_set = query_graph_manager.set_manager.GetJoinRelation(i);
		auto join_node = make_uniq<DPJoinNode>(relation_set);
		join_node->cost = 0;
		join_node->cardinality = stats.cardinality;
		D_ASSERT(join_node->set.count == 1);
		plans[relation_set] = std::move(join_node);
		cost_model.cardinality_estimator.InitCardinalityEstimatorProps(&relation_set, stats);
	}
}